

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_util.h
# Opt level: O3

bool google::protobuf::
     InsertIfNotPresent<std::map<std::pair<std::__cxx11::string,int>,std::pair<void_const*,int>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,std::pair<void_const*,int>>>>>
               (map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>_>
                *collection,first_type *key,second_type *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>,_bool>
  pVar3;
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>
  local_60;
  
  paVar1 = &local_60.first.first.field_2;
  pcVar2 = (key->first)._M_dataplus._M_p;
  local_60.first.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + (key->first)._M_string_length);
  local_60.first.second = key->second;
  local_60.second.first = value->first;
  local_60.second.second = value->second;
  local_60.second._12_4_ = *(undefined4 *)&value->field_0xc;
  pVar3 = std::
          _Rb_tree<std::pair<std::__cxx11::string,int>,std::pair<std::pair<std::__cxx11::string,int>const,std::pair<void_const*,int>>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,int>const,std::pair<void_const*,int>>>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,std::pair<void_const*,int>>>>
          ::
          _M_insert_unique<std::pair<std::pair<std::__cxx11::string,int>const,std::pair<void_const*,int>>const&>
                    ((_Rb_tree<std::pair<std::__cxx11::string,int>,std::pair<std::pair<std::__cxx11::string,int>const,std::pair<void_const*,int>>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,int>const,std::pair<void_const*,int>>>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,std::pair<void_const*,int>>>>
                      *)collection,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.first.first._M_dataplus._M_p,
                    local_60.first.first.field_2._M_allocated_capacity + 1);
  }
  return (bool)(pVar3.second & 1);
}

Assistant:

bool InsertIfNotPresent(
    Collection* const collection,
    const typename Collection::value_type::first_type& key,
    const typename Collection::value_type::second_type& value) {
  return InsertIfNotPresent(
      collection, typename Collection::value_type(key, value));
}